

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong local_40;
  size_t i_1;
  ulong uStack_30;
  int max;
  size_t i;
  int a [4];
  char **argv_local;
  int argc_local;
  
  a._8_8_ = argv;
  for (uStack_30 = 0; uStack_30 < 4; uStack_30 = uStack_30 + 1) {
    printf("%lu-th number: ",uStack_30 + 1);
    __isoc99_scanf("%d",a + (uStack_30 - 2));
  }
  i_1._4_4_ = 0;
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    if ((int)i_1._4_4_ < a[local_40 - 2]) {
      i_1._4_4_ = a[local_40 - 2];
    }
  }
  printf("The biggest number is %d.\n",(ulong)i_1._4_4_);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int a[N_INT];

  for (size_t i = 0; i < N_INT; i++) {
    printf("%lu-th number: ", i + 1);
    scanf("%d", &a[i]);
  }

  int max = 0;
  for (size_t i = 0; i < N_INT; i++) {
    if (a[i] > max) max = a[i];
  }

  printf("The biggest number is %d.\n", max);

  return 0;
}